

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O3

Matrix2f __thiscall Matrix2f::inverse(Matrix2f *this,bool *pbIsSingular,float epsilon)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 *in_RDX;
  float fVar5;
  Matrix2f MVar6;
  
  fVar1 = *(float *)pbIsSingular;
  fVar2 = *(float *)(pbIsSingular + 4);
  fVar3 = *(float *)(pbIsSingular + 0xc);
  fVar4 = *(float *)(pbIsSingular + 8);
  fVar5 = fVar1 * fVar3 - fVar2 * fVar4;
  if (ABS(fVar5) < epsilon) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    this->m_elements[0] = 0.0;
    this->m_elements[1] = 0.0;
    this->m_elements[2] = 0.0;
    this->m_elements[3] = 0.0;
    return (float  [4])(ZEXT416((uint)fVar3) << 0x40);
  }
  if (in_RDX != (undefined1 *)0x0) {
    *in_RDX = 0;
  }
  MVar6.m_elements[0] = 1.0 / fVar5;
  MVar6.m_elements[2] = fVar3 * MVar6.m_elements[0];
  MVar6.m_elements[3] = -fVar2 * MVar6.m_elements[0];
  this->m_elements[0] = MVar6.m_elements[2];
  this->m_elements[1] = MVar6.m_elements[3];
  this->m_elements[2] = -fVar4 * MVar6.m_elements[0];
  this->m_elements[3] = fVar1 * MVar6.m_elements[0];
  MVar6.m_elements[1] = MVar6.m_elements[0];
  return (Matrix2f)MVar6.m_elements;
}

Assistant:

Matrix2f Matrix2f::inverse( bool* pbIsSingular, float epsilon )
{
	float determinant = m_elements[ 0 ] * m_elements[ 3 ] - m_elements[ 2 ] * m_elements[ 1 ];

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix2f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix2f
		(
			m_elements[ 3 ] * reciprocalDeterminant, -m_elements[ 2 ] * reciprocalDeterminant,
			-m_elements[ 1 ] * reciprocalDeterminant, m_elements[ 0 ] * reciprocalDeterminant
		);
	}
}